

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PipelineClassifier::PipelineClassifier
          (PipelineClassifier *this,PipelineClassifier *from)

{
  void *pvVar1;
  Pipeline *from_00;
  Pipeline *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PipelineClassifier_004271b8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->pipeline_;
  if (from_00 == (Pipeline *)0x0 ||
      from == (PipelineClassifier *)&_PipelineClassifier_default_instance_) {
    this_00 = (Pipeline *)0x0;
  }
  else {
    this_00 = (Pipeline *)operator_new(0x48);
    Pipeline::Pipeline(this_00,from_00);
  }
  this->pipeline_ = this_00;
  return;
}

Assistant:

PipelineClassifier::PipelineClassifier(const PipelineClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_pipeline()) {
    pipeline_ = new ::CoreML::Specification::Pipeline(*from.pipeline_);
  } else {
    pipeline_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PipelineClassifier)
}